

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

void __thiscall wasm::LocalScanner::visitLocalSet(LocalScanner *this,LocalSet *curr)

{
  PassOptions *passOptions;
  bool bVar1;
  Function *this_00;
  Module *module;
  reference __a;
  uint *puVar2;
  Expression *pEVar3;
  Load *load_00;
  bool local_59;
  Load *load;
  Index signExtBits;
  value_type *info;
  Expression *value;
  Type local_28;
  Type type;
  Function *func;
  LocalSet *curr_local;
  LocalScanner *this_local;
  
  type.id = (uintptr_t)
            Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::getFunction
                      ((Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_> *)this)
  ;
  bVar1 = Function::isParam((Function *)type.id,curr->index);
  if (!bVar1) {
    this_00 = Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::getFunction
                        ((Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_> *)
                         this);
    local_28 = Function::getLocalType(this_00,curr->index);
    value._4_4_ = 2;
    bVar1 = wasm::Type::operator!=(&local_28,(BasicType *)((long)&value + 4));
    local_59 = false;
    if (bVar1) {
      value._0_4_ = 3;
      local_59 = wasm::Type::operator!=(&local_28,(BasicType *)&value);
    }
    if (local_59 == false) {
      pEVar3 = curr->value;
      passOptions = this->passOptions;
      module = Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::getModule
                         ((Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_> *)
                          this);
      info = (value_type *)Properties::getFallthrough(pEVar3,passOptions,module,AllowTeeBrIf);
      __a = std::vector<wasm::LocalInfo,_std::allocator<wasm::LocalInfo>_>::operator[]
                      (this->localInfo,(ulong)curr->index);
      _signExtBits = __a;
      load._4_4_ = Bits::getMaxBits<wasm::LocalScanner>((Expression *)info,this);
      puVar2 = std::max<unsigned_int>(&__a->maxBits,(uint *)((long)&load + 4));
      _signExtBits->maxBits = *puVar2;
      load._0_4_ = 0xffffffff;
      pEVar3 = Properties::getSignExtValue((Expression *)info);
      if (pEVar3 == (Expression *)0x0) {
        load_00 = Expression::dynCast<wasm::Load>((Expression *)info);
        if (((load_00 != (Load *)0x0) && (bVar1 = LoadUtils::isSignRelevant(load_00), bVar1)) &&
           ((load_00->signed_ & 1U) != 0)) {
          load._0_4_ = (uint)load_00->bytes << 3;
        }
      }
      else {
        load._0_4_ = Properties::getSignExtBits((Expression *)info);
      }
      if (_signExtBits->signExtBits == 0) {
        _signExtBits->signExtBits = (Index)load;
      }
      else if (_signExtBits->signExtBits != (Index)load) {
        _signExtBits->signExtBits = 0xffffffff;
      }
    }
  }
  return;
}

Assistant:

void visitLocalSet(LocalSet* curr) {
    auto* func = getFunction();
    if (func->isParam(curr->index)) {
      return;
    }
    auto type = getFunction()->getLocalType(curr->index);
    if (type != Type::i32 && type != Type::i64) {
      return;
    }
    // an integer var, worth processing
    auto* value =
      Properties::getFallthrough(curr->value, passOptions, *getModule());
    auto& info = localInfo[curr->index];
    info.maxBits = std::max(info.maxBits, Bits::getMaxBits(value, this));
    auto signExtBits = LocalInfo::kUnknown;
    if (Properties::getSignExtValue(value)) {
      signExtBits = Properties::getSignExtBits(value);
    } else if (auto* load = value->dynCast<Load>()) {
      if (LoadUtils::isSignRelevant(load) && load->signed_) {
        signExtBits = load->bytes * 8;
      }
    }
    if (info.signExtBits == 0) {
      info.signExtBits = signExtBits; // first info we see
    } else if (info.signExtBits != signExtBits) {
      // contradictory information, give up
      info.signExtBits = LocalInfo::kUnknown;
    }
  }